

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::Entity_Damage_Status_PDU
          (Entity_Damage_Status_PDU *this,EntityIdentifier *DamagedEntityID)

{
  EntityIdentifier *DamagedEntityID_local;
  Entity_Damage_Status_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Entity_Damage_Status_PDU_0033abf0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_DmgEnt,DamagedEntityID);
  this->m_ui16NumDmgDescRecs = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vDdRec);
  (this->super_Header).super_Header6.m_ui8PDUType = '7';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x18;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\a';
  return;
}

Assistant:

Entity_Damage_Status_PDU::Entity_Damage_Status_PDU( const EntityIdentifier & DamagedEntityID ) :
    m_DmgEnt( DamagedEntityID ),
    m_ui16NumDmgDescRecs( 0 )
{
    m_ui8PDUType = Acknowledge_R_PDU_Type;
    m_ui16PDULength = ENTITY_DAMAGE_STATE_PDU;
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_2012;
}